

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorSetLayout.cpp
# Opt level: O1

void __thiscall
myvk::DescriptorBindingFlagGroup::Initialize
          (DescriptorBindingFlagGroup *this,
          vector<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>
          *binding_flags)

{
  pointer *ppVVar1;
  pointer pVVar2;
  pointer puVar3;
  pointer ppVar4;
  iterator __position;
  iterator __position_00;
  VkDescriptorType VVar5;
  uint32_t uVar6;
  VkShaderStageFlags VVar7;
  pair<VkDescriptorSetLayoutBinding,_unsigned_int> *i;
  pointer __args;
  
  pVVar2 = (this->m_bindings).
           super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_bindings).
      super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (this->m_bindings).
    super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  puVar3 = (this->m_flags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_flags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->m_flags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  __args = (binding_flags->
           super__Vector_base<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (binding_flags->
           super__Vector_base<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>,_std::allocator<std::pair<VkDescriptorSetLayoutBinding,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__args != ppVar4) {
    do {
      __position._M_current =
           (this->m_bindings).
           super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_bindings).
          super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<VkDescriptorSetLayoutBinding,std::allocator<VkDescriptorSetLayoutBinding>>::
        _M_realloc_insert<VkDescriptorSetLayoutBinding_const&>
                  ((vector<VkDescriptorSetLayoutBinding,std::allocator<VkDescriptorSetLayoutBinding>>
                    *)this,__position,&__args->first);
      }
      else {
        (__position._M_current)->pImmutableSamplers = (__args->first).pImmutableSamplers;
        VVar5 = (__args->first).descriptorType;
        uVar6 = (__args->first).descriptorCount;
        VVar7 = (__args->first).stageFlags;
        (__position._M_current)->binding = (__args->first).binding;
        (__position._M_current)->descriptorType = VVar5;
        (__position._M_current)->descriptorCount = uVar6;
        (__position._M_current)->stageFlags = VVar7;
        ppVVar1 = &(this->m_bindings).
                   super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
      __position_00._M_current =
           (this->m_flags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->m_flags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_flags,__position_00
                   ,&__args->second);
      }
      else {
        *__position_00._M_current = __args->second;
        (this->m_flags).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      __args = __args + 1;
    } while (__args != ppVar4);
  }
  return;
}

Assistant:

void DescriptorBindingFlagGroup::Initialize(
    const std::vector<std::pair<VkDescriptorSetLayoutBinding, VkDescriptorBindingFlags>> &binding_flags) {
	m_bindings.clear();
	m_flags.clear();
	for (const auto &i : binding_flags) {
		m_bindings.push_back(i.first);
		m_flags.push_back(i.second);
	}
}